

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.h
# Opt level: O0

void __thiscall xLearn::Metric::Initialize(Metric *this,ThreadPool *pool)

{
  ostream *poVar1;
  ostream *poVar2;
  size_t sVar3;
  long in_RSI;
  long in_RDI;
  allocator local_71;
  string local_70 [40];
  string *in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffc4;
  string *in_stack_ffffffffffffffc8;
  LogSeverity in_stack_ffffffffffffffd4;
  Logger local_14 [5];
  
  if (in_RSI == 0) {
    Logger::Logger(local_14,ERR);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffffc8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/loss/metric.h"
               ,(allocator *)&stack0xffffffffffffffc7);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"Initialize",&local_71);
    poVar1 = Logger::Start(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffc8,
                           in_stack_ffffffffffffffc4,in_stack_ffffffffffffffb8);
    poVar1 = std::operator<<(poVar1,"CHECK failed ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/loss/metric.h"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar1,0x3f);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"pool");
    std::operator<<(poVar2," == NULL \n");
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffc7);
    Logger::~Logger((Logger *)poVar1);
    abort();
  }
  *(long *)(in_RDI + 8) = in_RSI;
  sVar3 = ThreadPool::ThreadNumber((ThreadPool *)0x1a48e9);
  *(size_t *)(in_RDI + 0x10) = sVar3;
  return;
}

Assistant:

void Initialize(ThreadPool* pool) {
    CHECK_NOTNULL(pool);
    pool_ = pool;
    threadNumber_ = pool_->ThreadNumber();
  }